

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::ObjectBegin(ParsedScene *this,string *name,FileLoc loc)

{
  FileLoc loc_00;
  bool bVar1;
  mapped_type *pmVar2;
  char (*in_RDI) [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  InstanceDefinitionSceneEntity *pIVar3;
  SceneRepresentation *in_stack_fffffffffffffef0;
  InstanceDefinitionSceneEntity *this_00;
  value_type *in_stack_fffffffffffffef8;
  InstanceDefinitionSceneEntity *in_stack_ffffffffffffff00;
  char (*pacVar4) [12];
  char *pcVar5;
  key_type *in_stack_ffffffffffffff28;
  FileLoc *in_stack_ffffffffffffff30;
  _Self local_48;
  _Self local_40;
  undefined1 local_31;
  
  pcVar5 = &stack0x00000008;
  if (*(int *)(in_RDI[0xb2] + 8) == 2) {
    Error<char_const(&)[12]>(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_RDI);
  }
  else if (*(int *)(in_RDI[0xb2] + 8) == 0) {
    Error<char_const(&)[12]>(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_RDI);
  }
  else {
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::push_back((vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
                 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::push_back
              ((vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_> *)
               in_stack_ffffffffffffff00,(value_type *)in_stack_fffffffffffffef8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff00,
               (value_type_conflict6 *)in_stack_fffffffffffffef8);
    pacVar4 = in_RDI + 0xec;
    local_31 = 0x6f;
    std::make_pair<char,pbrt::FileLoc&>
              ((char *)in_stack_fffffffffffffef0,(FileLoc *)in_stack_fffffffffffffee8);
    std::vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>::
    push_back((vector<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
               *)in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
    if (*(long *)in_RDI[0xee] == 0) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                   *)in_stack_fffffffffffffee8,(key_type *)0x678bae);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                  *)in_stack_fffffffffffffee8);
      bVar1 = std::operator!=(&local_40,&local_48);
      if (bVar1) {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  ((SceneRepresentation *)in_stack_ffffffffffffff00,
                   (FileLoc *)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
      }
      else {
        pIVar3 = *(InstanceDefinitionSceneEntity **)pcVar5;
        this_00 = *(InstanceDefinitionSceneEntity **)(pcVar5 + 8);
        loc_00.filename._M_str = pcVar5;
        loc_00.filename._M_len = (size_t)pacVar4;
        loc_00._16_8_ = in_RDI;
        InstanceDefinitionSceneEntity::InstanceDefinitionSceneEntity
                  (in_stack_ffffffffffffff00,*(string **)(pcVar5 + 0x10),loc_00);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                      *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        InstanceDefinitionSceneEntity::operator=(this_00,pIVar3);
        InstanceDefinitionSceneEntity::~InstanceDefinitionSceneEntity(this_00);
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                               *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        *(mapped_type **)in_RDI[0xee] = pmVar2;
      }
    }
    else {
      SceneRepresentation::ErrorExitDeferred<>
                (in_stack_fffffffffffffef0,(FileLoc *)in_stack_fffffffffffffee8,(char *)0x678b90);
    }
  }
  return;
}

Assistant:

void ParsedScene::ObjectBegin(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectBegin");
    pushedGraphicsStates.push_back(*graphicsState);
    pushedTransforms.push_back(curTransform);
    pushedActiveTransformBits.push_back(activeTransformBits);

    pushStack.push_back(std::make_pair('o', loc));

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc, "ObjectBegin called inside of instance definition");
        return;
    }

    if (instanceDefinitions.find(name) != instanceDefinitions.end()) {
        ErrorExitDeferred(&loc, "%s: trying to redefine an object instance", name);
        return;
    }

    instanceDefinitions[name] = InstanceDefinitionSceneEntity(name, loc);
    // This should be safe since we're not adding anything to
    // instanceDefinitions until after ObjectEnd... (Still makes me
    // nervous.)
    currentInstance = &instanceDefinitions[name];
}